

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O2

void rec_mm_comp_cdata(jit_State *J,RecordIndex *ix,int op,MMS mm)

{
  uint uVar1;
  long lStack_30;
  
  lj_snap_add(J);
  uVar1 = ix->val;
  if ((uVar1 & 0x1f000000) == 0xa000000) {
    lStack_30 = 0x10;
  }
  else {
    uVar1 = ix->key;
    lStack_30 = 8;
  }
  ix->tab = uVar1;
  ix->tabv = *(TValue *)((long)&ix->tabv + lStack_30);
  lj_record_mm_lookup(J,ix,mm);
  rec_mm_callcomp(J,ix,op);
  return;
}

Assistant:

static void rec_mm_comp_cdata(jit_State *J, RecordIndex *ix, int op, MMS mm)
{
  lj_snap_add(J);
  if (tref_iscdata(ix->val)) {
    ix->tab = ix->val;
    copyTV(J->L, &ix->tabv, &ix->valv);
  } else {
    lj_assertJ(tref_iscdata(ix->key), "cdata expected");
    ix->tab = ix->key;
    copyTV(J->L, &ix->tabv, &ix->keyv);
  }
  lj_record_mm_lookup(J, ix, mm);
  rec_mm_callcomp(J, ix, op);
}